

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkRedirectCiCo(Abc_Ntk_t *pNtk)

{
  Nm_Man_t *p;
  int iVar1;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  Abc_Obj_t *pObj_01;
  char *__s2;
  Abc_Obj_t *pNode;
  uint local_30;
  int nCiId;
  int Count;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObjCi;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_30 = 0;
  nCiId = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= nCiId) {
      if (local_30 != 0) {
        printf("Redirected %d POs from buffers to PIs with the same name.\n",(ulong)local_30);
      }
      return;
    }
    pObj_00 = Abc_NtkCo(pNtk,nCiId);
    p = pNtk->pManName;
    pcVar2 = Abc_ObjName(pObj_00);
    iVar1 = Nm_ManFindIdByNameTwoTypes(p,pcVar2,2,5);
    if (iVar1 != -1) {
      pObj_01 = Abc_NtkObj(pNtk,iVar1);
      pcVar2 = Abc_ObjName(pObj_00);
      __s2 = Abc_ObjName(pObj_01);
      iVar1 = strcmp(pcVar2,__s2);
      if (iVar1 != 0) {
        __assert_fail("!strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                      ,0x278,"void Abc_NtkRedirectCiCo(Abc_Ntk_t *)");
      }
      pNode = Abc_ObjFanin0(pObj_00);
      if (pNode != pObj_01) {
        iVar1 = Abc_NodeIsBuf(pNode);
        if (iVar1 == 0) {
          __assert_fail("Abc_NodeIsBuf(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                        ,0x27c,"void Abc_NtkRedirectCiCo(Abc_Ntk_t *)");
        }
        Abc_ObjPatchFanin(pObj_00,pNode,pObj_01);
        iVar1 = Abc_ObjFanoutNum(pNode);
        if (iVar1 == 0) {
          Abc_NtkDeleteObj(pNode);
        }
        local_30 = local_30 + 1;
      }
    }
    nCiId = nCiId + 1;
  } while( true );
}

Assistant:

void Abc_NtkRedirectCiCo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pObjCi, * pFanin; 
    int i, Count = 0;
    // if CO points to CI with the same name, remove buffer between them
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        int nCiId = Nm_ManFindIdByNameTwoTypes( pNtk->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( nCiId == -1 )
            continue;
        pObjCi = Abc_NtkObj( pNtk, nCiId );
        assert( !strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) ) );
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin == pObjCi )
            continue;
        assert( Abc_NodeIsBuf(pFanin) );
        Abc_ObjPatchFanin( pObj, pFanin, pObjCi );
        if ( Abc_ObjFanoutNum(pFanin) == 0 )
            Abc_NtkDeleteObj( pFanin );
        Count++;
    }
    if ( Count )
        printf( "Redirected %d POs from buffers to PIs with the same name.\n", Count );
}